

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O2

PlainObject * __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
          (PlainObject *__return_storage_ptr__,
          MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this)

{
  double dVar1;
  double local_38;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_30;
  
  local_38 = *(double *)(this + 0x10) * *(double *)(this + 0x10) +
             *(double *)(this + 8) * *(double *)(this + 8) + *(double *)this * *(double *)this;
  if (local_38 <= 0.0) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = *(double *)(this + 0x10);
    dVar1 = *(double *)(this + 8);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = *(double *)this;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar1;
  }
  else {
    local_38 = SQRT(local_38);
    MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (&local_30,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this,&local_38);
    PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)__return_storage_ptr__,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

typename MatrixBase<Derived>::PlainObject
MatrixBase<Derived>::normalized() const
{
  typedef typename internal::nested_eval<Derived,2>::type _Nested;
  _Nested n(derived());
  RealScalar z = n.squaredNorm();
  // NOTE: after extensive benchmarking, this conditional does not impact performance, at least on recent x86 CPU
  if(z>RealScalar(0))
    return n / numext::sqrt(z);
  else
    return n;
}